

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_sha256_init_create(secp256k1_sha256 *hash)

{
  secp256k1_sha256_initialize(hash);
  hash->s[0] = 0xd29e1bf5;
  hash->s[1] = 0xf7025f42;
  hash->s[2] = 0x9b024773;
  hash->s[3] = 0x94cb7d5;
  hash->s[4] = 0xe59ed789;
  hash->s[5] = 0x3bc9786;
  hash->s[6] = 0x68335b35;
  hash->s[7] = 0x4e363b53;
  hash->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_ellswift_sha256_init_create(secp256k1_sha256* hash) {
    secp256k1_sha256_initialize(hash);
    hash->s[0] = 0xd29e1bf5ul;
    hash->s[1] = 0xf7025f42ul;
    hash->s[2] = 0x9b024773ul;
    hash->s[3] = 0x094cb7d5ul;
    hash->s[4] = 0xe59ed789ul;
    hash->s[5] = 0x03bc9786ul;
    hash->s[6] = 0x68335b35ul;
    hash->s[7] = 0x4e363b53ul;

    hash->bytes = 64;
}